

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicRectMatrix.hpp
# Opt level: O0

void __thiscall
OpenMD::DynamicRectMatrix<double>::DynamicRectMatrix(DynamicRectMatrix<double> *this,SelfType *m)

{
  DynamicRectMatrix<double> *in_RSI;
  long *in_RDI;
  uint j;
  uint i;
  uint in_stack_ffffffffffffffe8;
  uint uVar1;
  uint in_stack_ffffffffffffffec;
  uint uVar2;
  
  getNRow(in_RSI);
  getNCol(in_RSI);
  allocate(in_RSI,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8);
  for (uVar2 = 0; uVar2 < *(uint *)(in_RDI + 1); uVar2 = uVar2 + 1) {
    for (uVar1 = 0; uVar1 < *(uint *)((long)in_RDI + 0xc); uVar1 = uVar1 + 1) {
      *(double *)(*(long *)(*in_RDI + (ulong)uVar2 * 8) + (ulong)uVar1 * 8) =
           in_RSI->data_[uVar2][uVar1];
    }
  }
  return;
}

Assistant:

DynamicRectMatrix(const SelfType& m) {
      allocate(m.getNRow(), m.getNCol());

      for (unsigned int i = 0; i < nrow_; i++)
        for (unsigned int j = 0; j < ncol_; j++)
          this->data_[i][j] = m.data_[i][j];
    }